

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilitySelector.hpp
# Opt level: O2

Status __thiscall
AO::BehaviorTree::Version_1::Details::ProbabilitySelector<Agent,_short>::execute
          (ProbabilitySelector<Agent,_short> *this,EntityPtr entity,short args)

{
  element_type *peVar1;
  Status SVar2;
  int iVar3;
  ulong uVar4;
  __node_base *p_Var5;
  result_type_conflict rVar6;
  float fVar7;
  uniform_real_distribution<float> distribution;
  
  peVar1 = (this->currentNode).
           super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if (ProbabilitySelector<Agent,short>::execute(Agent*,short)::generator == '\0') {
      iVar3 = __cxa_guard_acquire(&ProbabilitySelector<Agent,short>::execute(Agent*,short)::
                                   generator);
      if (iVar3 != 0) {
        uVar4 = std::chrono::_V2::system_clock::now();
        iVar3 = (int)((uVar4 & 0xffffffff) % 0x7fffffff);
        execute::generator._M_x = (unsigned_long)(iVar3 + (uint)(iVar3 == 0));
        __cxa_guard_release(&ProbabilitySelector<Agent,short>::execute(Agent*,short)::generator);
      }
    }
    distribution._M_param = (param_type)((ulong)(uint)this->totalSum << 0x20);
    rVar6 = std::uniform_real_distribution<float>::operator()(&distribution,&execute::generator);
    p_Var5 = &(this->weightingMap)._M_h._M_before_begin;
    fVar7 = 0.0;
    do {
      p_Var5 = p_Var5->_M_nxt;
      if (p_Var5 == (__node_base *)0x0) {
        __assert_fail("!\"Weighting is too high\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herpec-j[P]BehaviorTree//BehaviorTree/Includes/BehaviorTree/Details/ProbabilitySelector.hpp"
                      ,0x54,
                      "virtual Status AO::BehaviorTree::Details::ProbabilitySelector<Agent, short>::execute(EntityPtr, Args...) [Entity = Agent, Args = <short>]"
                     );
      }
      fVar7 = fVar7 + *(float *)(p_Var5 + 3);
    } while (fVar7 < rVar6);
    SVar2 = (*(code *)(p_Var5[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var5[1]._M_nxt,entity,(int)args);
    if (SVar2 == Running) {
      std::
      __shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&(this->currentNode).
                   super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                  ,(__shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                    *)(p_Var5 + 1));
    }
  }
  else {
    iVar3 = (*(peVar1->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                      (peVar1,entity,(ulong)(uint)(int)args);
    SVar2 = Running;
    if ((Status)iVar3 != Running) {
      std::
      __shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
      ::reset(&(this->currentNode).
               super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
             );
      SVar2 = (Status)iVar3;
    }
  }
  return SVar2;
}

Assistant:

Status execute(EntityPtr entity, Args... args) override final
					{
						if (currentNode)
						{
							Status const status = currentNode->execute(entity, args...);
							if (status != Status::Running)
							{
								currentNode.reset();
							}
							return status;
						}
						else
						{
							static std::default_random_engine generator(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
							std::uniform_real_distribution<float> distribution(0.0f, totalSum);
							float const chosen = distribution(generator);
							float sum = 0.0f;
							for (auto &weighting : weightingMap)
							{
								sum += weighting.second;
								if (sum >= chosen)
								{
									Status const status = weighting.first->execute(entity, args...);
									if (status == Status::Running)
									{
										currentNode = weighting.first;
									}
									return status;
								}
							}
							assert(!"Weighting is too high");
							return Status::Failure;
						}
					}